

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

void __thiscall CVmImageLoader::load_const_pool_def(CVmImageLoader *this,ulong siz)

{
  char buf [32];
  ushort local_38 [20];
  
  if (siz < 10) {
    err_throw(0x132);
  }
  (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,local_38,10);
  if (0xfffffffd < local_38[0] - 3) {
    CVmImagePool::init(this->pools_[local_38[0] - 1],(EVP_PKEY_CTX *)this->fp_);
    return;
  }
  err_throw(0x135);
}

Assistant:

void CVmImageLoader::read_data(char *buf, size_t read_len,
                               ulong *remaining_size)
{
    /* ensure we have enough data left in our block */
    if (read_len > *remaining_size)
        err_throw(VMERR_IMAGE_BLOCK_TOO_SMALL);

    /* decrement the remaining size counter for the data we just read */
    *remaining_size -= read_len;

    /* read the data */
    fp_->copy_data(buf, read_len);
}